

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiveSession.cpp
# Opt level: O2

void __thiscall FileReceiveSession::on_input(FileReceiveSession *this,Poll *p)

{
  ssize_t sVar1;
  ostream *poVar2;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  sVar1 = read((this->super_Subscriber).fd,FILE_REC_BUF,10000);
  if ((int)sVar1 < 0) {
    if ((this->fail).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::__cxx11::string::string(local_40,(string *)&this->file);
      std::function<void_(boost::filesystem::path)>::operator()(&this->fail,(path *)local_40);
      std::__cxx11::string::~string(local_40);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Error in reading from socket ");
  }
  else {
    if ((int)sVar1 == 0) {
      std::fstream::close();
      if ((this->success).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::__cxx11::string::string(local_80,(string *)&this->file);
        std::function<void_(boost::filesystem::path)>::operator()(&this->success,(path *)local_80);
        std::__cxx11::string::~string(local_80);
      }
      goto LAB_001447a5;
    }
    std::ostream::write(&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.
                         field_0x10,0x15bca0);
    if (((&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x20)
         [*(long *)(*(long *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_> +
                   -0x18)] & 5) == 0) {
      return;
    }
    if ((this->fail).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::__cxx11::string::string(local_60,(string *)&this->file);
      std::function<void_(boost::filesystem::path)>::operator()(&this->fail,(path *)local_60);
      std::__cxx11::string::~string(local_60);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Could not write to file ");
    poVar2 = boost::filesystem::operator<<(poVar2,&this->file);
  }
  std::endl<char,std::char_traits<char>>(poVar2);
LAB_001447a5:
  Poll::unsubscribe(p,&this->super_Subscriber);
  return;
}

Assistant:

void FileReceiveSession::on_input(Poll &p) {
  int bytes = read(fd, FILE_REC_BUF, FILE_REC_BUF_SIZE);
  if (bytes < 0) {
    if (this->fail)
      this->fail(file);
    std::cout << "Error in reading from socket " << std::endl;
    p.unsubscribe(*this);
    return;
  } else if (bytes > 0) {
    stream.write(FILE_REC_BUF, bytes);
    if (!stream) {
      if (this->fail)
        this->fail(file);
      std::cout << "Could not write to file " << file << std::endl;
      p.unsubscribe(*this);
    }
  } else {
    stream.close();
    if (this->success)
      success(file);
    p.unsubscribe(*this);
  }
}